

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor.cpp
# Opt level: O0

void __thiscall Executor::visit(Executor *this,UnaryNode *node)

{
  ExpressionNode *pEVar1;
  pointer pVVar2;
  optional<double> *__args;
  unique_ptr<Value,_std::default_delete<Value>_> *this_00;
  unique_ptr<Number,_std::default_delete<Number>_> *__u;
  UnaryNode *in_RSI;
  Value *in_RDI;
  Executor *unaff_retaddr;
  double newValue;
  double term;
  NumberValueAnalyser analyser;
  key_type *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  int iVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  NumberValueAnalyser local_68;
  string local_38 [24];
  Node *in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 uVar4;
  Value *value;
  
  value = in_RDI;
  pEVar1 = UnaryNode::getTerm((UnaryNode *)0x15cb31);
  (*(pEVar1->super_Node)._vptr_Node[2])(pEVar1,in_RDI);
  std::unique_ptr<Value,_std::default_delete<Value>_>::operator*
            ((unique_ptr<Value,_std::default_delete<Value>_> *)
             CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  uVar4 = 0;
  UnaryNode::getOperation(in_RSI);
  std::
  unordered_map<UnaryOperator,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<UnaryOperator>,_std::equal_to<UnaryOperator>,_std::allocator<std::pair<const_UnaryOperator,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::at((unordered_map<UnaryOperator,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<UnaryOperator>,_std::equal_to<UnaryOperator>,_std::allocator<std::pair<const_UnaryOperator,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),in_stack_ffffffffffffff38);
  std::operator+(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  assertValueType(unaff_retaddr,value,(TypeName *)in_RSI,
                  (string *)CONCAT44(uVar4,in_stack_ffffffffffffffe8),in_stack_ffffffffffffffe0);
  std::__cxx11::string::~string(local_38);
  NumberValueAnalyser::NumberValueAnalyser
            ((NumberValueAnalyser *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  pVVar2 = std::unique_ptr<Value,_std::default_delete<Value>_>::operator->
                     ((unique_ptr<Value,_std::default_delete<Value>_> *)0x15cbe8);
  (*pVVar2->_vptr_Value[3])(pVVar2,&local_68);
  __args = NumberValueAnalyser::getValue(&local_68);
  this_00 = (unique_ptr<Value,_std::default_delete<Value>_> *)
            std::optional<double>::value
                      ((optional<double> *)
                       CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  __u = (unique_ptr<Number,_std::default_delete<Number>_> *)UnaryNode::getOperation(in_RSI);
  iVar3 = *(int *)&(__u->_M_t).super___uniq_ptr_impl<Number,_std::default_delete<Number>_>._M_t.
                   super__Tuple_impl<0UL,_Number_*,_std::default_delete<Number>_>.
                   super__Head_base<0UL,_Number_*,_false>._M_head_impl;
  std::make_unique<Number,double&>((double *)__args);
  std::unique_ptr<Value,std::default_delete<Value>>::operator=(this_00,__u);
  std::unique_ptr<Number,_std::default_delete<Number>_>::~unique_ptr
            ((unique_ptr<Number,_std::default_delete<Number>_> *)
             CONCAT44(iVar3,in_stack_ffffffffffffff40));
  NumberValueAnalyser::~NumberValueAnalyser((NumberValueAnalyser *)0x15cd61);
  return;
}

Assistant:

void Executor::visit(const UnaryNode& node)
{
  node.getTerm().accept(*this);

  assertValueType(*value_, TypeName::F32,
    "unary operation " + UnaryOperationNames.at(node.getOperation()), node);

  NumberValueAnalyser analyser{};
  value_->accept(analyser);
  auto term = analyser.getValue().value();
  auto newValue = term;
  switch(node.getOperation())
  {
    case UnaryOperator::BinaryNegation:
      newValue = ~static_cast<unsigned int>(term);
      break;
    case UnaryOperator::LogicalNot:
      newValue = term == 0 ? 1 : 0;
      break;
    case UnaryOperator::Minus:
      newValue = -term;
      break;
  }

  value_ = std::make_unique<Number>(newValue);
}